

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t *
Gia_RsbSetFind(word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,Vec_Wrd_t *vSimsT,int nWordsT,
              Vec_Int_t *vCands)

{
  Gia_RsbMan_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vObjs;
  Gia_RsbMan_t *p;
  int nWordsT_local;
  Vec_Wrd_t *vSimsT_local;
  int nWords_local;
  Vec_Wrd_t *vSims_local;
  word *pOnSet_local;
  word *pOffSet_local;
  
  p_00 = Gia_RsbAlloc((Gia_Man_t *)0x0,pOffSet,pOnSet,vSims,nWords,vSimsT,nWordsT,vCands);
  p_01 = Gia_RsbSolve(p_00);
  Gia_RsbFree(p_00);
  Vec_IntSort(p_01,0);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_RsbSetFind( word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    Gia_RsbMan_t * p  = Gia_RsbAlloc( NULL, pOffSet, pOnSet, vSims, nWords, vSimsT, nWordsT, vCands );
    Vec_Int_t * vObjs = Gia_RsbSolve( p );
    Gia_RsbFree( p );
    Vec_IntSort( vObjs, 0 );
    return vObjs;
}